

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O2

void cm_zlib__tr_stored_block(deflate_state *s,charf *buf,ulg stored_len,int last)

{
  Bytef BVar1;
  ulg uVar2;
  int iVar3;
  uint uVar4;
  ushort uVar5;
  
  iVar3 = s->bi_valid;
  if (iVar3 < 0xe) {
    s->bi_buf = s->bi_buf | (ushort)(last << ((byte)iVar3 & 0x1f));
    iVar3 = iVar3 + 3;
  }
  else {
    uVar5 = (ushort)(last << ((byte)iVar3 & 0x1f)) | s->bi_buf;
    s->bi_buf = uVar5;
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = (Bytef)uVar5;
    BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = BVar1;
    s->bi_buf = (ush)((last & 0xffffU) >> (0x10U - (char)s->bi_valid & 0x1f));
    iVar3 = s->bi_valid + -0xd;
  }
  s->bi_valid = iVar3;
  bi_windup(s);
  uVar2 = s->pending;
  s->pending = uVar2 + 1;
  s->pending_buf[uVar2] = (Bytef)stored_len;
  uVar2 = s->pending;
  s->pending = uVar2 + 1;
  s->pending_buf[uVar2] = (Bytef)(stored_len >> 8);
  uVar4 = (uint)stored_len ^ 0xffff;
  uVar2 = s->pending;
  s->pending = uVar2 + 1;
  s->pending_buf[uVar2] = (Bytef)uVar4;
  uVar2 = s->pending;
  s->pending = uVar2 + 1;
  s->pending_buf[uVar2] = (Bytef)(uVar4 >> 8);
  if (stored_len != 0) {
    memcpy(s->pending_buf + s->pending,buf,stored_len);
  }
  s->pending = s->pending + stored_len;
  return;
}

Assistant:

void ZLIB_INTERNAL _tr_stored_block(s, buf, stored_len, last)
    deflate_state *s;
    charf *buf;       /* input block */
    ulg stored_len;   /* length of input block */
    int last;         /* one if this is the last block for a file */
{
    send_bits(s, (STORED_BLOCK<<1)+last, 3);    /* send block type */
    bi_windup(s);        /* align on byte boundary */
    put_short(s, (ush)stored_len);
    put_short(s, (ush)~stored_len);
    if (stored_len)
        zmemcpy(s->pending_buf + s->pending, (Bytef *)buf, stored_len);
    s->pending += stored_len;
#ifdef ZLIB_DEBUG
    s->compressed_len = (s->compressed_len + 3 + 7) & (ulg)~7L;
    s->compressed_len += (stored_len + 4) << 3;
    s->bits_sent += 2*16;
    s->bits_sent += stored_len<<3;
#endif
}